

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

PHYSFS_Io * ZIP_openRead(void *opaque,char *filename)

{
  PHYSFS_uint32 *keys;
  PHYSFS_uint8 val;
  _func_PHYSFS_sint64_PHYSFS_Io_ptr_void_ptr_PHYSFS_uint64 *p_Var1;
  code *pcVar2;
  PHYSFS_uint64 PVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  ZIPentry *entry;
  PHYSFS_Io *pPVar7;
  long *__s;
  PHYSFS_Io *pPVar8;
  ZIPentry *pZVar9;
  void *pvVar10;
  char *path;
  PHYSFS_sint64 PVar11;
  byte val_00;
  long lVar12;
  undefined1 *puVar13;
  undefined8 *puVar14;
  undefined1 *ptr;
  PHYSFS_Io *pPVar15;
  size_t __n;
  uint uVar16;
  PHYSFS_uint8 *pPVar17;
  byte bVar18;
  undefined1 auStack_48 [4];
  byte local_44 [8];
  PHYSFS_uint8 crypto_header [12];
  
  bVar18 = 0;
  puVar13 = auStack_48;
  entry = (ZIPentry *)__PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,filename);
  if (entry == (ZIPentry *)0x0) {
    if (*(int *)((long)opaque + 0x34) == 0) {
      return (PHYSFS_Io *)0x0;
    }
    crypto_header._4_8_ = strrchr(filename,0x24);
    if ((char *)crypto_header._4_8_ == (char *)0x0) {
      return (PHYSFS_Io *)0x0;
    }
    __n = crypto_header._4_8_ - (long)filename;
    if (__n + 1 < 0x100) {
      ptr = auStack_48 + -(__n + 0x18 & 0xfffffffffffffff0);
      puVar13 = ptr;
    }
    else {
      ptr = (undefined1 *)0x0;
      puVar13 = auStack_48;
    }
    *(undefined8 *)(puVar13 + -8) = 0x114740;
    path = (char *)__PHYSFS_initSmallAlloc(ptr,__n + 1);
    if (path != (char *)0x0) {
      *(undefined8 *)(puVar13 + -8) = 0x114756;
      memcpy(path,filename,__n);
      path[__n] = '\0';
      *(undefined8 *)(puVar13 + -8) = 0x114766;
      entry = (ZIPentry *)__PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
      *(undefined8 *)(puVar13 + -8) = 0x114771;
      __PHYSFS_smallFree(path);
      if (entry == (ZIPentry *)0x0) {
        return (PHYSFS_Io *)0x0;
      }
      pPVar17 = (PHYSFS_uint8 *)(crypto_header._4_8_ + 1);
      goto LAB_001145aa;
    }
LAB_00114782:
    puVar14 = (undefined8 *)(puVar13 + -8);
    *(undefined8 *)(puVar13 + -8) = 2;
LAB_00114784:
    uVar4 = *puVar14;
    *puVar14 = 0x11478a;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar4);
    return (PHYSFS_Io *)0x0;
  }
  pPVar17 = (PHYSFS_uint8 *)0x0;
LAB_001145aa:
  pPVar7 = *(PHYSFS_Io **)((long)opaque + 0x28);
  *(undefined8 *)(puVar13 + -8) = 0x1145ba;
  iVar6 = zip_resolve(pPVar7,(ZIPinfo *)opaque,entry);
  if (iVar6 == 0) {
    return (PHYSFS_Io *)0x0;
  }
  if ((entry->tree).isdir != 0) {
    puVar14 = (undefined8 *)(puVar13 + -8);
    *(undefined8 *)(puVar13 + -8) = 0x10;
    goto LAB_00114784;
  }
  *(undefined8 *)(puVar13 + -8) = 0x50;
  PVar3 = *(PHYSFS_uint64 *)(puVar13 + -8);
  *(undefined8 *)(puVar13 + -8) = 0x11462a;
  pPVar7 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(PVar3);
  if (pPVar7 == (PHYSFS_Io *)0x0) goto LAB_00114782;
  *(undefined8 *)(puVar13 + -8) = 0x114641;
  __s = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(0xa8);
  if (__s == (long *)0x0) {
    *(undefined8 *)(puVar13 + -8) = 2;
    uVar4 = *(undefined8 *)(puVar13 + -8);
    *(undefined8 *)(puVar13 + -8) = 0x1147a6;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar4);
    goto LAB_001148c0;
  }
  *(undefined8 *)(puVar13 + -8) = 0x11465c;
  memset(__s,0,0xa8);
  pPVar8 = *(PHYSFS_Io **)((long)opaque + 0x28);
  *(undefined8 *)(puVar13 + -8) = 0x11466c;
  pPVar8 = zip_get_io(pPVar8,(ZIPinfo *)opaque,entry);
  iVar6 = (int)opaque;
  if (pPVar8 != (PHYSFS_Io *)0x0) {
    __s[1] = (long)pPVar8;
    pZVar9 = entry->symlink;
    if (entry->symlink == (ZIPentry *)0x0) {
      pZVar9 = entry;
    }
    *__s = (long)pZVar9;
    __s[0xf] = 0;
    __s[0x10] = 0;
    __s[0x11] = 0;
    __s[0x12] = 0;
    __s[7] = 0;
    __s[8] = 0;
    __s[9] = 0;
    __s[10] = 0;
    __s[0xb] = 0;
    __s[0xc] = 0;
    __s[0xd] = 0;
    __s[0xe] = 0;
    __s[0x13] = 0;
    __s[0x14] = 0;
    __s[0xf] = (long)zlibPhysfsAlloc;
    __s[0x10] = (long)zlibPhysfsFree;
    __s[0x11] = (long)&__PHYSFS_AllocatorHooks;
    if (pZVar9->compression_method == 0) {
LAB_00114720:
      if ((entry->general_bits & 1) == 0) {
        if (pPVar17 == (PHYSFS_uint8 *)0x0) {
LAB_0011486f:
          *(undefined8 *)(puVar13 + -8) = 10;
          pPVar8 = &ZIP_Io;
          pPVar15 = pPVar7;
          for (lVar12 = *(long *)(puVar13 + -8); lVar12 != 0; lVar12 = lVar12 + -1) {
            uVar5 = *(undefined4 *)&pPVar8->field_0x4;
            pPVar15->version = pPVar8->version;
            *(undefined4 *)&pPVar15->field_0x4 = uVar5;
            pPVar8 = (PHYSFS_Io *)((long)pPVar8 + ((ulong)bVar18 * -2 + 1) * 8);
            pPVar15 = (PHYSFS_Io *)((long)pPVar15 + (ulong)bVar18 * -0x10 + 8);
          }
          pPVar7->opaque = __s;
          return pPVar7;
        }
      }
      else if (pPVar17 != (PHYSFS_uint8 *)0x0) {
        *(undefined8 *)(puVar13 + -8) = 0xc;
        PVar3 = *(PHYSFS_uint64 *)(puVar13 + -8);
        p_Var1 = pPVar8->read;
        *(undefined8 *)(puVar13 + -8) = 0x1147c3;
        PVar11 = (*p_Var1)(pPVar8,local_44,PVar3);
        uVar4 = crypto_header._4_8_;
        if (PVar11 != 0xc) goto LAB_00114890;
        lVar12 = *__s;
        if ((*(byte *)(lVar12 + 0x44) & 8) == 0) {
          crypto_header[4] = *(byte *)(lVar12 + 0x4b);
        }
        else {
          crypto_header[4] = *(byte *)(lVar12 + 0x69);
        }
        crypto_header[5] = '\0';
        crypto_header[6] = '\0';
        crypto_header[7] = '\0';
        crypto_header._8_4_ = SUB84(uVar4,4);
        keys = (PHYSFS_uint32 *)(__s + 4);
        __s[4] = 0x2345678912345678;
        *(undefined4 *)(__s + 5) = 0x34567890;
        for (; val = *pPVar17, val != '\0'; pPVar17 = pPVar17 + 1) {
          *(undefined8 *)(puVar13 + -8) = 0x114819;
          zip_update_crypto_keys(keys,val);
        }
        uVar16 = 0;
        for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 1) {
          val_00 = (byte)((*(uint *)(__s + 5) & 0xfffd ^ 3) * (*(uint *)(__s + 5) | 2) >> 8) ^
                   local_44[lVar12];
          uVar16 = (uint)val_00;
          *(undefined8 *)(puVar13 + -8) = 0x114853;
          zip_update_crypto_keys(keys,val_00);
        }
        if (uVar16 == crypto_header._4_4_) {
          *(int *)((long)__s + 0x34) = (int)__s[5];
          *(undefined8 *)((long)__s + 0x2c) = *(undefined8 *)keys;
          goto LAB_0011486f;
        }
      }
      *(undefined8 *)(puVar13 + -8) = 0x1c;
    }
    else {
      *(undefined8 *)(puVar13 + -8) = 0x1146ef;
      pvVar10 = (*__PHYSFS_AllocatorHooks.Malloc)(0x4000);
      __s[3] = (long)pvVar10;
      if (pvVar10 != (void *)0x0) {
        *(undefined8 *)(puVar13 + -8) = 0x114705;
        iVar6 = mz_inflateInit2((mz_streamp)(__s + 7),iVar6);
        crypto_header._4_8_ = pPVar17;
        *(undefined8 *)(puVar13 + -8) = 0x114713;
        zlib_err(iVar6);
        pPVar17 = (PHYSFS_uint8 *)crypto_header._4_8_;
        if (iVar6 != 0) goto LAB_00114890;
        goto LAB_00114720;
      }
      *(undefined8 *)(puVar13 + -8) = 2;
    }
    uVar4 = *(undefined8 *)(puVar13 + -8);
    *(undefined8 *)(puVar13 + -8) = 0x114890;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar4);
  }
LAB_00114890:
  if (__s[1] != 0) {
    pcVar2 = *(code **)(__s[1] + 0x48);
    *(undefined8 *)(puVar13 + -8) = 0x11489c;
    (*pcVar2)();
  }
  pvVar10 = (void *)__s[3];
  if (pvVar10 != (void *)0x0) {
    *(undefined8 *)(puVar13 + -8) = 0x1148ab;
    (*__PHYSFS_AllocatorHooks.Free)(pvVar10);
    *(undefined8 *)(puVar13 + -8) = 0x1148b7;
    mz_inflateEnd((mz_streamp)(__s + 7));
  }
  *(undefined8 *)(puVar13 + -8) = 0x1148c0;
  (*__PHYSFS_AllocatorHooks.Free)(__s);
LAB_001148c0:
  *(undefined8 *)(puVar13 + -8) = 0x1148c9;
  (*__PHYSFS_AllocatorHooks.Free)(pPVar7);
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *ZIP_openRead(void *opaque, const char *filename)
{
    PHYSFS_Io *retval = NULL;
    ZIPinfo *info = (ZIPinfo *) opaque;
    ZIPentry *entry = zip_find_entry(info, filename);
    ZIPfileinfo *finfo = NULL;
    PHYSFS_Io *io = NULL;
    PHYSFS_uint8 *password = NULL;

    /* if not found, see if maybe "$PASSWORD" is appended. */
    if ((!entry) && (info->has_crypto))
    {
        const char *ptr = strrchr(filename, '$');
        if (ptr != NULL)
        {
            const size_t len = (size_t) (ptr - filename);
            char *str = (char *) __PHYSFS_smallAlloc(len + 1);
            BAIL_IF(!str, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
            memcpy(str, filename, len);
            str[len] = '\0';
            entry = zip_find_entry(info, str);
            __PHYSFS_smallFree(str);
            password = (PHYSFS_uint8 *) (ptr + 1);
        } /* if */
    } /* if */

    BAIL_IF_ERRPASS(!entry, NULL);

    BAIL_IF_ERRPASS(!zip_resolve(info->io, info, entry), NULL);

    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);

    finfo = (ZIPfileinfo *) allocator.Malloc(sizeof (ZIPfileinfo));
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);
    memset(finfo, '\0', sizeof (ZIPfileinfo));

    io = zip_get_io(info->io, info, entry);
    GOTO_IF_ERRPASS(!io, ZIP_openRead_failed);
    finfo->io = io;
    finfo->entry = ((entry->symlink != NULL) ? entry->symlink : entry);
    initializeZStream(&finfo->stream);

    if (finfo->entry->compression_method != COMPMETH_NONE)
    {
        finfo->buffer = (PHYSFS_uint8 *) allocator.Malloc(ZIP_READBUFSIZE);
        if (!finfo->buffer)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);
        else if (zlib_err(inflateInit2(&finfo->stream, -MAX_WBITS)) != Z_OK)
            goto ZIP_openRead_failed;
    } /* if */

    if (!zip_entry_is_tradional_crypto(entry))
        GOTO_IF(password != NULL, PHYSFS_ERR_BAD_PASSWORD, ZIP_openRead_failed);
    else
    {
        PHYSFS_uint8 crypto_header[12];
        GOTO_IF(password == NULL, PHYSFS_ERR_BAD_PASSWORD, ZIP_openRead_failed);
        if (io->read(io, crypto_header, 12) != 12)
            goto ZIP_openRead_failed;
        else if (!zip_prep_crypto_keys(finfo, crypto_header, password))
            goto ZIP_openRead_failed;
    } /* if */

    memcpy(retval, &ZIP_Io, sizeof (PHYSFS_Io));
    retval->opaque = finfo;

    return retval;

ZIP_openRead_failed:
    if (finfo != NULL)
    {
        if (finfo->io != NULL)
            finfo->io->destroy(finfo->io);

        if (finfo->buffer != NULL)
        {
            allocator.Free(finfo->buffer);
            inflateEnd(&finfo->stream);
        } /* if */

        allocator.Free(finfo);
    } /* if */

    if (retval != NULL)
        allocator.Free(retval);

    return NULL;
}